

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pig2vcd.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  gpioReport_t report;
  timeval now;
  tm local_68;
  
  sVar3 = read(0,&report,0xc);
  if ((int)sVar3 != 0xc) {
    exit(-1);
  }
  gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
  localtime_r((time_t *)&now,&local_68);
  strftime(timeStamp_buf,0x20,"%F %T",&local_68);
  printf("$date %s $end\n",timeStamp_buf);
  puts("$version pig2vcd V1 $end");
  puts("$timescale 1 us $end");
  puts("$scope module top $end");
  for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
    uVar4 = uVar6 + 0x41;
    if (0x19 < uVar6) {
      uVar4 = uVar6 + 0x47;
    }
    printf("$var wire 1 %c %d $end\n",(ulong)uVar4,(ulong)uVar6);
  }
  puts("$upscope $end");
  puts("$enddefinitions $end");
  uVar1 = report.tick;
  uVar6 = 0;
  while (sVar3 = read(0,&report,0xc), uVar2 = report.level, (int)sVar3 == 0xc) {
    if (report.level != uVar6) {
      printf("#%u\n",(ulong)(report.tick - uVar1));
      uVar4 = uVar6 ^ uVar2;
      for (uVar5 = 0; uVar6 = uVar2, uVar5 != 0x20; uVar5 = uVar5 + 1) {
        if ((uVar4 >> (uVar5 & 0x1f) & 1) != 0) {
          uVar6 = uVar5 + 0x41;
          if (0x19 < uVar5) {
            uVar6 = uVar5 + 0x47;
          }
          printf("%c%c\n",(ulong)(0x31 - ((1 << ((byte)uVar5 & 0x1f) & uVar2) == 0)),(ulong)uVar6);
        }
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[])
{
   int b, r, v;
   uint32_t t0;
   uint32_t lastLevel, changed;

   gpioReport_t report;

   r=read(STDIN_FILENO, &report, RS);

   if (r != RS) exit(-1);

   printf("$date %s $end\n", timeStamp());
   printf("$version pig2vcd V1 $end\n");
   printf("$timescale 1 us $end\n");
   printf("$scope module top $end\n");

   for (b=0; b<32; b++)
      printf("$var wire 1 %c %d $end\n", symbol(b), b);
        
   printf("$upscope $end\n");
   printf("$enddefinitions $end\n");
         
   t0 = report.tick;
   lastLevel =0;

   while ((r=read(STDIN_FILENO, &report, RS)) == RS)
   {
      if (report.level != lastLevel)
      {
         printf("#%u\n", report.tick - t0);

         changed = report.level ^ lastLevel;

         lastLevel = report.level;

         for (b=0; b<32; b++)
         {
            if (changed & (1<<b))
            {
               if (report.level & (1<<b)) v='1'; else v='0';

               printf("%c%c\n", v, symbol(b));
            }
         }
      }
   }
   return 0;
}